

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O1

int __thiscall
glcts::SampleShadingRenderTests::init(SampleShadingRenderTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  SampleShadingRenderFormatTests *pSVar2;
  bool *extension;
  TextureFormat local_38;
  
  pSVar2 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  local_38.order = RGBA;
  local_38.type = UNORM_INT8;
  extension = fixed_sample_locations_values + 1;
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar2,(this->super_TestCaseGroup).m_context,this->m_glslVersion,0x8058,"rgba8",
             &local_38,"sampler2DMS","vec4",0.0,1.0,fixed_sample_locations_values + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  local_38.order = RGBA;
  local_38.type = SIGNED_INT8;
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar2,(this->super_TestCaseGroup).m_context,this->m_glslVersion,0x8d8e,"rgba8i",
             &local_38,"isampler2DMS","ivec4",-128.0,127.0,fixed_sample_locations_values + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  local_38 = (TextureFormat)&DAT_1e00000008;
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar2,(this->super_TestCaseGroup).m_context,this->m_glslVersion,0x8d7c,"rgba8ui",
             &local_38,"usampler2DMS","uvec4",0.0,255.0,fixed_sample_locations_values + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  uVar1 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar1 & 0x300) == 0) {
    extension = (bool *)0x1c1a0e2;
  }
  pSVar2 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  local_38.order = RGBA;
  local_38.type = FLOAT;
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar2,(this->super_TestCaseGroup).m_context,this->m_glslVersion,0x8814,"rgba32f",
             &local_38,"sampler2DMS","vec4",0.0,1.0,extension);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  return extraout_EAX;
}

Assistant:

void SampleShadingRenderTests::init(void)
{
	// sample_shading.render.rgba8
	addChild(new SampleShadingRenderFormatTests(
		m_context, m_glslVersion, GL_RGBA8, "rgba8",
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), "sampler2DMS", "vec4", 0.0, 1.0));
	// sample_shading.render.rgba8i
	addChild(new SampleShadingRenderFormatTests(
		m_context, m_glslVersion, GL_RGBA8I, "rgba8i",
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT8), "isampler2DMS", "ivec4", -128.0,
		127.0));
	// sample_shading.render.rgba8ui
	addChild(new SampleShadingRenderFormatTests(
		m_context, m_glslVersion, GL_RGBA8UI, "rgba8ui",
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8), "usampler2DMS", "uvec4", 0.0,
		255.0));
	// sample_shading.render.rgba32f
	const char* extension =
		(glu::isContextTypeES(m_context.getRenderContext().getType())) ? "GL_EXT_color_buffer_float" : "";
	addChild(new SampleShadingRenderFormatTests(m_context, m_glslVersion, GL_RGBA32F, "rgba32f",
												tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT),
												"sampler2DMS", "vec4", 0.0, 1.0, extension));
}